

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_global_hold_socket_locked(nn_sock **sockp,int s)

{
  nn_sock *self;
  int iVar1;
  bool local_29;
  nn_sock *sock;
  int s_local;
  nn_sock **sockp_local;
  
  if (::self.socks == (nn_sock **)0x0) {
    *sockp = (nn_sock *)0x0;
    sockp_local._4_4_ = -0x9523dfd;
  }
  else if ((::self.flags & 1U) == 0) {
    local_29 = (uint)s < 0x200;
    if (local_29) {
      self = ::self.socks[s];
      if (self == (nn_sock *)0x0) {
        sockp_local._4_4_ = -9;
      }
      else {
        iVar1 = nn_sock_hold(self);
        if (iVar1 == 0) {
          *sockp = self;
          sockp_local._4_4_ = 0;
        }
        else {
          sockp_local._4_4_ = -9;
        }
      }
    }
    else {
      sockp_local._4_4_ = -9;
    }
  }
  else {
    *sockp = (nn_sock *)0x0;
    sockp_local._4_4_ = -0x9523dfd;
  }
  return sockp_local._4_4_;
}

Assistant:

int nn_global_hold_socket_locked(struct nn_sock **sockp, int s)
{
    struct nn_sock *sock;

    if (nn_slow (self.socks == NULL)) {
        *sockp = NULL;
        return -ETERM;
    }
    if (nn_slow ((self.flags & NN_CTX_FLAG_ZOMBIE) != 0)) {
        *sockp = NULL;
        return -ETERM;
    }

    if (nn_slow (s < 0 || s >= NN_MAX_SOCKETS))
        return -EBADF;

    sock = self.socks[s];
    if (nn_slow (sock == NULL))
        return -EBADF;

    if (nn_slow (nn_sock_hold (sock) != 0)) {
        return -EBADF;
    }
    *sockp = sock;
    return 0;
}